

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AddInt64(i64 *pA,i64 iB)

{
  long lVar1;
  i64 iA;
  i64 iB_local;
  i64 *pA_local;
  
  lVar1 = *pA;
  if (iB < 0) {
    if ((lVar1 < 0) && (iB + 1 < -(lVar1 + 0x7fffffffffffffff))) {
      return 1;
    }
  }
  else if ((0 < lVar1) && (0x7fffffffffffffff - lVar1 < iB)) {
    return 1;
  }
  *pA = iB + *pA;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3AddInt64(i64 *pA, i64 iB){
#if GCC_VERSION>=5004000 && !defined(__INTEL_COMPILER)
  return __builtin_add_overflow(*pA, iB, pA);
#else
  i64 iA = *pA;
  testcase( iA==0 ); testcase( iA==1 );
  testcase( iB==-1 ); testcase( iB==0 );
  if( iB>=0 ){
    testcase( iA>0 && LARGEST_INT64 - iA == iB );
    testcase( iA>0 && LARGEST_INT64 - iA == iB - 1 );
    if( iA>0 && LARGEST_INT64 - iA < iB ) return 1;
  }else{
    testcase( iA<0 && -(iA + LARGEST_INT64) == iB + 1 );
    testcase( iA<0 && -(iA + LARGEST_INT64) == iB + 2 );
    if( iA<0 && -(iA + LARGEST_INT64) > iB + 1 ) return 1;
  }
  *pA += iB;
  return 0; 
#endif
}